

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_cse_conv(jit_State *J)

{
  ushort uVar1;
  int iVar2;
  IRIns *pIVar3;
  bool bVar4;
  byte bVar5;
  TRef in_EAX;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((J->flags & 0x20000) != 0) {
    uVar1 = (J->fold).ins.field_0.op1;
    uVar7 = (uint)J->chain[0x59];
    do {
      uVar6 = uVar7;
      if (uVar6 <= uVar1) break;
      pIVar3 = (J->cur).ir;
      uVar8 = (ulong)uVar6;
      if (((pIVar3[uVar8].field_0.op1 == uVar1) &&
          (((*(ushort *)((long)pIVar3 + uVar8 * 8 + 2) ^ (J->fold).ins.field_0.op2) & 0xfff) == 0))
         && (((J->fold).ins.field_1.t.irt & 0x80) <=
             (*(byte *)((long)pIVar3 + uVar8 * 8 + 4) & 0x80))) {
        bVar4 = false;
        uVar7 = uVar6;
        in_EAX = uVar6;
      }
      else {
        bVar4 = true;
        uVar7 = (uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
      }
    } while (bVar4);
    if (uVar1 < uVar6) {
      return in_EAX;
    }
  }
  uVar7 = (J->cur).nins;
  uVar8 = (ulong)uVar7;
  if (J->irtoplim <= uVar7) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar7 + 1;
  pIVar3 = (J->cur).ir;
  bVar5 = (J->fold).ins.field_1.o;
  *(IRRef1 *)((long)pIVar3 + uVar8 * 8 + 6) = J->chain[bVar5];
  J->chain[bVar5] = (IRRef1)uVar7;
  *(byte *)((long)pIVar3 + uVar8 * 8 + 5) = bVar5;
  pIVar3[uVar8].field_0.op1 = (J->fold).ins.field_0.op1;
  *(IRRef1 *)((long)pIVar3 + uVar8 * 8 + 2) = (J->fold).ins.field_0.op2;
  iVar2 = *(int *)((long)&(J->fold).ins + 4);
  bVar5 = (byte)iVar2;
  (J->guardemit).irt = (J->guardemit).irt | bVar5;
  *(byte *)((long)pIVar3 + uVar8 * 8 + 4) = bVar5;
  return iVar2 * 0x1000000 + uVar7;
}

Assistant:

LJFOLD(CONV any any)
LJFOLDF(cse_conv)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef op1 = fins->op1, op2 = (fins->op2 & IRCONV_MODEMASK);
    uint8_t guard = irt_isguard(fins->t);
    IRRef ref = J->chain[IR_CONV];
    while (ref > op1) {
      IRIns *ir = IR(ref);
      /* Commoning with stronger checks is ok. */
      if (ir->op1 == op1 && (ir->op2 & IRCONV_MODEMASK) == op2 &&
	  irt_isguard(ir->t) >= guard)
	return ref;
      ref = ir->prev;
    }
  }
  return EMITFOLD;  /* No fallthrough to regular CSE. */
}